

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QTzType>::data(QList<QTzType> *this)

{
  QArrayDataPointer<QTzType> *this_00;
  QTzType *pQVar1;
  QArrayDataPointer<QTzType> *in_RDI;
  
  detach((QList<QTzType> *)0x75dd2c);
  this_00 = (QArrayDataPointer<QTzType> *)QArrayDataPointer<QTzType>::operator->(in_RDI);
  pQVar1 = QArrayDataPointer<QTzType>::data(this_00);
  return pQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }